

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

char * start_capture(MatchState *ms,char *s,char *p,int what)

{
  byte bVar1;
  char *pcVar2;
  
  bVar1 = ms->level;
  if (0x1f < bVar1) {
    luaL_error(ms->L,"too many captures");
  }
  ms->capture[bVar1].init = s;
  ms->capture[bVar1].len = (long)what;
  ms->level = bVar1 + 1;
  pcVar2 = match(ms,s,p);
  if (pcVar2 == (char *)0x0) {
    ms->level = ms->level + 0xff;
  }
  return pcVar2;
}

Assistant:

static const char *start_capture (MatchState *ms, const char *s,
                                    const char *p, int what) {
  const char *res;
  int level = ms->level;
  if (level >= LUA_MAXCAPTURES) luaL_error(ms->L, "too many captures");
  ms->capture[level].init = s;
  ms->capture[level].len = what;
  ms->level = level+1;
  if ((res=match(ms, s, p)) == NULL)  /* match failed? */
    ms->level--;  /* undo capture */
  return res;
}